

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csg_parser.cpp
# Opt level: O2

token * ocmesh::details::lex(token *__return_storage_ptr__,istream *stream)

{
  char __c;
  kind_t kVar1;
  int iVar2;
  string *text;
  float value;
  size_type local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  skipwhile<int(*)(int)noexcept>(stream,isspace);
  skipcomments(stream);
  if (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 2) == 0) {
    __c = std::istream::peek();
    if (__c == '}') {
      std::istream::get();
      text = &local_a0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)text,"}",(allocator<char> *)&value);
      kVar1 = rbrace;
    }
    else {
      iVar2 = (int)__c;
      if (iVar2 == 0x29) {
        std::istream::get();
        text = &local_60;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)text,")",(allocator<char> *)&value);
        kVar1 = rparen;
      }
      else if (iVar2 == 0x2c) {
        std::istream::get();
        text = &local_e0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)text,",",(allocator<char> *)&value);
        kVar1 = comma;
      }
      else if (iVar2 == 0x3b) {
        std::istream::get();
        text = &local_c0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)text,";",(allocator<char> *)&value);
        kVar1 = semicolon;
      }
      else if (iVar2 == 0x3d) {
        std::istream::get();
        text = &local_100;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)text,"=",(allocator<char> *)&value);
        kVar1 = equals;
      }
      else if (iVar2 == 0x7b) {
        std::istream::get();
        text = &local_80;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)text,"{",(allocator<char> *)&value);
        kVar1 = lbrace;
      }
      else if (iVar2 == 0x28) {
        std::istream::get();
        text = &local_40;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)text,"(",(allocator<char> *)&value);
        kVar1 = lparen;
      }
      else {
        if (iVar2 - 0x30U < 10 || __c == '-') {
          std::istream::_M_extract<float>((float *)stream);
          token::token(__return_storage_ptr__,value);
          return __return_storage_ptr__;
        }
        if ((__c == '_') || (iVar2 = isalpha(iVar2), iVar2 != 0)) {
          _value = (pointer)&local_170;
          local_178 = 0;
          local_170._M_local_buf[0] = '\0';
          while ((__c == '_' || (iVar2 = isalnum((int)__c), iVar2 != 0))) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,
                      __c);
            std::istream::get();
            __c = std::istream::peek();
          }
          kVar1 = find_keyword((string *)&value);
          std::__cxx11::string::string
                    ((string *)&local_140,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value);
          token::token(__return_storage_ptr__,kVar1,&local_140);
          std::__cxx11::string::~string((string *)&local_140);
          text = (string *)&value;
          goto LAB_00108eef;
        }
        local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
        local_160._M_string_length = 0;
        local_160.field_2._M_local_buf[0] = '\0';
        text = &local_160;
        kVar1 = unknown;
      }
    }
  }
  else {
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    local_120._M_string_length = 0;
    local_120.field_2._M_local_buf[0] = '\0';
    kVar1 = eof;
    text = &local_120;
  }
  token::token(__return_storage_ptr__,kVar1,text);
LAB_00108eef:
  std::__cxx11::string::~string((string *)text);
  return __return_storage_ptr__;
}

Assistant:

token lex(std::istream &stream)
    {
        skipwhile(stream, isspace);
        
        skipcomments(stream);
        
        if(stream.eof())
            return token::eof;
        
        // Peek at next character
        char c = stream.peek();
        
        // Lex punctuation
        switch (c) {
            case '(':
                stream.get();
                return token(token::lparen, "(");
            case ')':
                stream.get();
                return token(token::rparen, ")");
            case '{':
                stream.get();
                return token(token::lbrace, "{");
            case '}':
                stream.get();
                return token(token::rbrace, "}");
            case ';':
                stream.get();
                return token(token::semicolon, ";");
            case ',':
                stream.get();
                return token(token::comma, ",");
            case '=':
                stream.get();
                return token(token::equals, "=");
        }
        
        // Lex numbers
        if(c == '-' || std::isdigit(c)) {
            float value;
            stream >> value;
            return token(value);
        }
        
        // Lex identifiers
        if(c == '_' || std::isalpha(c)) {
            std::string id;
            while (c == '_' || std::isalnum(c)) {
                id.push_back(c);
                stream.get();
                c = stream.peek();
            }
            
            return token(find_keyword(id), id);
        }
        
        return token::unknown;
    }